

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O1

ssize_t __thiscall
gvr::anon_unknown_3::PLYValueFloat64::write(PLYValueFloat64 *this,int __fd,void *__buf,size_t __n)

{
  undefined1 *puVar1;
  ssize_t sVar2;
  void *extraout_RDX;
  undefined4 in_register_00000034;
  long *plVar3;
  ulong in_XMM0_Qa;
  
  plVar3 = (long *)CONCAT44(in_register_00000034,__fd);
  if ((undefined1 *)plVar3[5] < (undefined1 *)plVar3[6]) {
    *(undefined1 *)plVar3[5] = (char)in_XMM0_Qa;
    plVar3[5] = plVar3[5] + 1;
  }
  else {
    (**(code **)(*plVar3 + 0x68))(plVar3,in_XMM0_Qa & 0xff);
    __buf = extraout_RDX;
  }
  if ((undefined1 *)plVar3[5] < (undefined1 *)plVar3[6]) {
    *(undefined1 *)plVar3[5] = (char)(in_XMM0_Qa >> 8);
    plVar3[5] = plVar3[5] + 1;
  }
  else {
    (**(code **)(*plVar3 + 0x68))(plVar3,in_XMM0_Qa >> 8 & 0xff,__buf);
  }
  if ((undefined1 *)plVar3[5] < (undefined1 *)plVar3[6]) {
    *(undefined1 *)plVar3[5] = (char)(in_XMM0_Qa >> 0x10);
    plVar3[5] = plVar3[5] + 1;
  }
  else {
    (**(code **)(*plVar3 + 0x68))(plVar3,in_XMM0_Qa >> 0x10 & 0xff);
  }
  if ((undefined1 *)plVar3[5] < (undefined1 *)plVar3[6]) {
    *(undefined1 *)plVar3[5] = (char)(in_XMM0_Qa >> 0x18);
    plVar3[5] = plVar3[5] + 1;
  }
  else {
    (**(code **)(*plVar3 + 0x68))(plVar3,in_XMM0_Qa >> 0x18 & 0xff);
  }
  if ((undefined1 *)plVar3[5] < (undefined1 *)plVar3[6]) {
    *(undefined1 *)plVar3[5] = (char)(in_XMM0_Qa >> 0x20);
    plVar3[5] = plVar3[5] + 1;
  }
  else {
    (**(code **)(*plVar3 + 0x68))(plVar3,in_XMM0_Qa >> 0x20 & 0xff);
  }
  if ((undefined1 *)plVar3[5] < (undefined1 *)plVar3[6]) {
    *(undefined1 *)plVar3[5] = (char)(in_XMM0_Qa >> 0x28);
    plVar3[5] = plVar3[5] + 1;
  }
  else {
    (**(code **)(*plVar3 + 0x68))(plVar3,in_XMM0_Qa >> 0x28 & 0xff);
  }
  if ((undefined1 *)plVar3[5] < (undefined1 *)plVar3[6]) {
    *(undefined1 *)plVar3[5] = (char)(in_XMM0_Qa >> 0x30);
    plVar3[5] = plVar3[5] + 1;
  }
  else {
    (**(code **)(*plVar3 + 0x68))(plVar3,in_XMM0_Qa >> 0x30 & 0xff);
  }
  puVar1 = (undefined1 *)plVar3[5];
  if (puVar1 < (undefined1 *)plVar3[6]) {
    *puVar1 = (char)(in_XMM0_Qa >> 0x38);
    plVar3[5] = plVar3[5] + 1;
    return (ssize_t)puVar1;
  }
  sVar2 = (**(code **)(*plVar3 + 0x68))(plVar3,in_XMM0_Qa >> 0x38);
  return sVar2;
}

Assistant:

void write(std::streambuf *out, double v)
    {
      char *p=reinterpret_cast<char *>(&v);
      out->sputc(p[0]);
      out->sputc(p[1]);
      out->sputc(p[2]);
      out->sputc(p[3]);
      out->sputc(p[4]);
      out->sputc(p[5]);
      out->sputc(p[6]);
      out->sputc(p[7]);
    }